

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t __n;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  bool bVar4;
  undefined8 *puVar5;
  Type *s;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint8_t *puVar11;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  if ((uVar1 & 2) != 0) {
    puVar5 = (undefined8 *)((ulong)(this->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->package_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar10 = 0;
    do {
      s = internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->dependency_).super_RepeatedPtrFieldBase,iVar10);
      internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "google.protobuf.FileDescriptorProto.dependency");
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x1a';
        target[1] = (uint8_t)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,target);
      }
      iVar10 = iVar10 + 1;
    } while (iVar2 != iVar10);
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->message_type_).super_RepeatedPtrFieldBase,iVar10);
      *target = '\"';
      uVar3 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar3;
      if (uVar3 < 0x80) {
        puVar11 = target + 2;
      }
      else {
        puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
      }
      target = DescriptorProto::_InternalSerialize(this_02,puVar11,stream);
      iVar10 = iVar10 + 1;
    } while (iVar2 != iVar10);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_03 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar10);
      *target = '*';
      uVar3 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar3;
      if (uVar3 < 0x80) {
        puVar11 = target + 2;
      }
      else {
        puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
      }
      target = EnumDescriptorProto::_InternalSerialize(this_03,puVar11,stream);
      iVar10 = iVar10 + 1;
    } while (iVar2 != iVar10);
  }
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (&(this->service_).super_RepeatedPtrFieldBase,iVar10);
      *target = '2';
      uVar3 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar3;
      if (uVar3 < 0x80) {
        puVar11 = target + 2;
      }
      else {
        puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
      }
      target = ServiceDescriptorProto::_InternalSerialize(this_04,puVar11,stream);
      iVar10 = iVar10 + 1;
    } while (iVar2 != iVar10);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_05 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(this->extension_).super_RepeatedPtrFieldBase,iVar10);
      *target = ':';
      uVar3 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
      target[1] = (uint8_t)uVar3;
      if (uVar3 < 0x80) {
        puVar11 = target + 2;
      }
      else {
        puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
      }
      target = FieldDescriptorProto::_InternalSerialize(this_05,puVar11,stream);
      iVar10 = iVar10 + 1;
    } while (iVar2 != iVar10);
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = 'B';
    uVar3 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar3;
    if (uVar3 < 0x80) {
      puVar11 = target + 2;
    }
    else {
      puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
    }
    target = FileOptions::_InternalSerialize(this_00,puVar11,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->source_code_info_;
    *target = 'J';
    uVar3 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar3;
    if (uVar3 < 0x80) {
      puVar11 = target + 2;
    }
    else {
      puVar11 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar3,target + 1);
    }
    target = SourceCodeInfo::_InternalSerialize(this_01,puVar11,stream);
  }
  iVar2 = (this->public_dependency_).current_size_;
  if (0 < iVar2) {
    iVar10 = 0;
    do {
      puVar11 = target;
      if (stream->end_ <= target) {
        puVar11 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar6 = (uint *)RepeatedField<int>::Get(&this->public_dependency_,iVar10);
      uVar3 = *puVar6;
      *puVar11 = 'P';
      puVar11[1] = (byte)uVar3;
      if ((ulong)(long)(int)uVar3 < 0x80) {
        target = puVar11 + 2;
      }
      else {
        puVar11[1] = (byte)uVar3 | 0x80;
        uVar7 = (ulong)(long)(int)uVar3 >> 7;
        puVar11[2] = (uint8_t)uVar7;
        target = puVar11 + 3;
        if (0x3fff < uVar3) {
          uVar9 = (ulong)puVar11[2];
          do {
            target[-1] = (byte)uVar9 | 0x80;
            uVar8 = uVar7 >> 7;
            *target = (uint8_t)uVar8;
            target = target + 1;
            uVar9 = uVar8 & 0xffffffff;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar4);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  iVar2 = (this->weak_dependency_).current_size_;
  if (0 < iVar2) {
    iVar10 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar6 = (uint *)RepeatedField<int>::Get(&this->weak_dependency_,iVar10);
      uVar3 = *puVar6;
      *target = 'X';
      target[1] = (byte)uVar3;
      if ((ulong)(long)(int)uVar3 < 0x80) {
        puVar11 = target + 2;
      }
      else {
        target[1] = (byte)uVar3 | 0x80;
        uVar7 = (ulong)(long)(int)uVar3 >> 7;
        target[2] = (uint8_t)uVar7;
        puVar11 = target + 3;
        if (0x3fff < uVar3) {
          uVar9 = (ulong)target[2];
          do {
            puVar11[-1] = (byte)uVar9 | 0x80;
            uVar8 = uVar7 >> 7;
            *puVar11 = (uint8_t)uVar8;
            puVar11 = puVar11 + 1;
            uVar9 = uVar8 & 0xffffffff;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar4);
        }
      }
      target = puVar11;
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar2);
  }
  if ((uVar1 & 4) != 0) {
    puVar5 = (undefined8 *)((ulong)(this->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,
                        (string *)((ulong)(this->syntax_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar11 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffc) + 8),target,stream);
    return puVar11;
  }
  return target;
}

Assistant:

uint8_t* FileDescriptorProto::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}